

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to4.h
# Opt level: O1

void ncnn::conv3x3s1_pack1to4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 (*pauVar1) [12];
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  void *pvVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 (*pauVar47) [16];
  undefined1 (*pauVar48) [16];
  ulong uVar49;
  undefined1 (*pauVar50) [16];
  long lVar51;
  void *pvVar52;
  int iVar53;
  uint uVar54;
  uint uVar55;
  undefined1 (*pauVar56) [16];
  ulong uVar57;
  undefined1 (*pauVar58) [16];
  undefined1 (*pauVar59) [16];
  int iVar60;
  ulong uVar61;
  undefined1 (*pauVar62) [16];
  ulong uVar63;
  undefined1 (*pauVar64) [16];
  ulong uVar65;
  void *pvVar66;
  undefined1 (*pauVar67) [16];
  long lVar68;
  void *pvVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar95 [64];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  ulong local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 *local_78;
  
  uVar19 = bottom_blob->c;
  uVar20 = top_blob->w;
  iVar21 = top_blob->h;
  iVar22 = top_blob->c;
  pvVar23 = _bias->data;
  uVar57 = (long)iVar22 & 0xfffffffffffffffe;
  if (0 < iVar22 >> 1) {
    uVar65 = 0;
    do {
      uVar61 = (long)top_blob->h * (long)top_blob->w;
      uVar49 = top_blob->elemsize;
      uVar63 = (uVar49 * uVar61 + 0xf & 0xfffffffffffffff0) / uVar49;
      if (top_blob->dims == 4) {
        uVar63 = uVar61;
      }
      auVar70 = ZEXT816(0) << 0x40;
      auVar71 = ZEXT816(0) << 0x40;
      if (pvVar23 != (void *)0x0) {
        auVar71 = *(undefined1 (*) [16])((long)pvVar23 + uVar65 * 0x20);
      }
      lVar51 = uVar49 * top_blob->cstep;
      pvVar66 = top_blob->data;
      lVar68 = uVar65 * 2 + 1;
      iVar53 = top_blob->d;
      if (pvVar23 != (void *)0x0) {
        auVar70 = *(undefined1 (*) [16])((long)pvVar23 + lVar68 * 0x10);
      }
      pauVar62 = (undefined1 (*) [16])(lVar51 * uVar65 * 2 + (long)pvVar66);
      iVar60 = iVar53 * (int)uVar63;
      pauVar50 = pauVar62;
      if (0 < iVar60) {
        do {
          *pauVar50 = auVar71;
          iVar60 = iVar60 + -1;
          pauVar50 = pauVar50 + 1;
        } while (iVar60 != 0);
      }
      pauVar50 = (undefined1 (*) [16])((long)pvVar66 + lVar51 * lVar68);
      iVar53 = iVar53 * (int)uVar63;
      pauVar67 = pauVar50;
      if (0 < iVar53) {
        do {
          *pauVar67 = auVar70;
          iVar53 = iVar53 + -1;
          pauVar67 = pauVar67 + 1;
        } while (iVar53 != 0);
      }
      if (0 < (int)uVar19) {
        pauVar67 = (undefined1 (*) [16])
                   (lVar68 * kernel->elemsize * kernel->cstep + (long)kernel->data);
        local_78 = (undefined8 *)
                   (uVar65 * 2 * kernel->cstep * kernel->elemsize + (long)kernel->data);
        local_d8 = 0;
        do {
          if (0 < iVar21) {
            uVar38 = *local_78;
            uVar39 = local_78[1];
            pauVar1 = (undefined1 (*) [12])(local_78 + 2);
            auVar40 = *pauVar1;
            local_f8 = (float)*(undefined8 *)*pauVar1;
            fStack_f4 = (float)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
            fStack_f0 = (float)local_78[3];
            fStack_ec = (float)((ulong)local_78[3] >> 0x20);
            auVar71 = *(undefined1 (*) [16])(local_78 + 4);
            auVar70 = *(undefined1 (*) [16])(local_78 + 6);
            auVar15 = *(undefined1 (*) [16])(local_78 + 8);
            fVar24 = *(float *)*(undefined1 (*) [12])(local_78 + 10);
            fVar25 = *(float *)((long)local_78 + 0x54);
            fVar26 = *(float *)(local_78 + 0xb);
            auVar45 = *(undefined1 (*) [12])(local_78 + 10);
            fVar27 = *(float *)((long)local_78 + 0x5c);
            auVar16 = *(undefined1 (*) [16])(local_78 + 0xc);
            fVar28 = *(float *)(local_78 + 0xe);
            fVar29 = *(float *)((long)local_78 + 0x74);
            fVar30 = *(float *)(local_78 + 0xf);
            fVar31 = *(float *)((long)local_78 + 0x7c);
            auVar17 = *(undefined1 (*) [16])(local_78 + 0x10);
            auVar72 = *pauVar67;
            auVar83 = ZEXT1664(auVar72);
            auVar43 = *(undefined1 (*) [12])pauVar67[1];
            auVar44 = pauVar67[1];
            fVar85 = *(float *)pauVar67[2];
            fVar86 = *(float *)(pauVar67[2] + 4);
            fVar87 = *(float *)(pauVar67[2] + 8);
            fVar88 = *(float *)(pauVar67[2] + 0xc);
            fVar89 = *(float *)pauVar67[3];
            fVar90 = *(float *)(pauVar67[3] + 4);
            fVar91 = *(float *)(pauVar67[3] + 8);
            fVar32 = *(float *)(pauVar67[3] + 0xc);
            fVar33 = *(float *)pauVar67[4];
            fVar34 = *(float *)(pauVar67[4] + 4);
            fVar35 = *(float *)(pauVar67[4] + 8);
            fVar36 = *(float *)(pauVar67[4] + 0xc);
            auVar73 = pauVar67[5];
            auVar74 = pauVar67[6];
            pvVar52 = (void *)(bottom_blob->cstep * local_d8 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar68 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar66 = (void *)((long)pvVar52 + lVar68 * 2);
            pvVar69 = (void *)(lVar68 + (long)pvVar52);
            iVar53 = 0;
            auVar18 = pauVar67[7];
            auVar95 = ZEXT1664(auVar18);
            pauVar58 = pauVar67 + 8;
            auVar42 = *(undefined1 (*) [12])*pauVar58;
            auVar41 = *(undefined1 (*) [12])*pauVar58;
            local_b8 = (float)*(undefined8 *)*pauVar58;
            fStack_b4 = (float)((ulong)*(undefined8 *)*pauVar58 >> 0x20);
            fStack_b0 = (float)*(undefined8 *)(pauVar67[8] + 8);
            fStack_ac = (float)((ulong)*(undefined8 *)(pauVar67[8] + 8) >> 0x20);
            pauVar58 = pauVar50;
            pauVar59 = pauVar62;
            do {
              local_1f8 = (float)uVar38;
              fStack_1f0 = (float)uVar39;
              local_1c8 = auVar71._0_4_;
              fStack_1c0 = auVar71._8_4_;
              fStack_1bc = auVar71._12_4_;
              local_198 = auVar70._0_4_;
              fStack_194 = auVar70._4_4_;
              fStack_190 = auVar70._8_4_;
              fStack_18c = auVar70._12_4_;
              local_1a8 = auVar15._0_4_;
              fStack_1a0 = auVar15._8_4_;
              fStack_19c = auVar15._12_4_;
              local_1d8 = auVar44._0_4_;
              fVar37 = local_1d8;
              fStack_1d0 = auVar44._8_4_;
              fStack_1cc = auVar44._12_4_;
              local_e8 = auVar72._0_4_;
              fStack_e4 = auVar72._4_4_;
              fStack_e0 = auVar72._8_4_;
              fStack_dc = auVar72._12_4_;
              local_1b8 = auVar16._0_4_;
              fStack_1b4 = auVar16._4_4_;
              fStack_1b0 = auVar16._8_4_;
              fStack_1ac = auVar16._12_4_;
              fStack_134 = auVar73._4_4_;
              fStack_130 = auVar73._8_4_;
              fStack_12c = auVar73._12_4_;
              fStack_144 = auVar17._4_4_;
              fStack_140 = auVar17._8_4_;
              fStack_13c = auVar17._12_4_;
              local_108 = auVar74._0_4_;
              fStack_104 = auVar74._4_4_;
              fStack_100 = auVar74._8_4_;
              fStack_fc = auVar74._12_4_;
              fStack_1f4 = (float)((ulong)uVar38 >> 0x20);
              fStack_1ec = (float)((ulong)uVar39 >> 0x20);
              fStack_1c4 = auVar71._4_4_;
              fStack_1a4 = auVar15._4_4_;
              fStack_1d4 = auVar43._4_4_;
              fStack_c4 = auVar18._4_4_;
              fStack_c0 = auVar18._8_4_;
              fStack_bc = auVar18._12_4_;
              local_138 = auVar73._0_4_;
              local_148 = auVar17._0_4_;
              local_c8 = auVar18._0_4_;
              if ((int)uVar20 < 4) {
                uVar55 = 0;
              }
              else {
                iVar60 = 3;
                lVar68 = 0;
                pauVar47 = pauVar58;
                pauVar48 = pauVar59;
                do {
                  pauVar64 = pauVar48;
                  pauVar56 = pauVar47;
                  fVar4 = *(float *)((long)pvVar52 + lVar68);
                  fVar5 = *(float *)((long)pvVar52 + lVar68 + 4);
                  fVar6 = *(float *)((long)pvVar52 + lVar68 + 8);
                  fVar92 = *(float *)((long)pvVar69 + lVar68);
                  fVar93 = *(float *)((long)pvVar69 + lVar68 + 4);
                  fVar94 = *(float *)((long)pvVar69 + lVar68 + 8);
                  fVar7 = *(float *)((long)pvVar66 + lVar68);
                  pauVar48 = (undefined1 (*) [16])(pauVar59[4] + lVar68 * 4);
                  fVar10 = *(float *)(pauVar48[-4] + 4);
                  fVar11 = *(float *)(pauVar48[-4] + 8);
                  fVar12 = *(float *)(pauVar48[-4] + 0xc);
                  fVar8 = *(float *)((long)pvVar66 + lVar68 + 4);
                  local_1d8 = auVar43._0_4_;
                  fVar9 = *(float *)((long)pvVar66 + lVar68 + 8);
                  pauVar47 = (undefined1 (*) [16])(pauVar58[4] + lVar68 * 4);
                  fVar13 = *(float *)pauVar47[-4];
                  fVar14 = *(float *)(pauVar47[-4] + 4);
                  fVar80 = *(float *)(pauVar47[-4] + 8);
                  fVar81 = *(float *)(pauVar47[-4] + 0xc);
                  *(float *)pauVar48[-4] =
                       fVar5 * local_f8 + fVar6 * local_1c8 + fVar92 * local_198 + fVar94 * fVar24 +
                       fVar8 * fVar28 +
                       fVar93 * local_1a8 + fVar4 * local_1f8 + *(float *)pauVar48[-4] +
                       fVar7 * local_1b8 + fVar9 * local_148;
                  *(float *)(pauVar48[-4] + 4) =
                       fVar5 * fStack_f4 + fVar6 * fStack_1c4 + fVar92 * fStack_194 +
                       fVar94 * fVar25 + fVar8 * fVar29 +
                       fVar93 * fStack_1a4 + fVar4 * fStack_1f4 + fVar10 + fVar7 * fStack_1b4 +
                       fVar9 * fStack_144;
                  *(float *)(pauVar48[-4] + 8) =
                       fVar5 * fStack_f0 + fVar6 * fStack_1c0 + fVar92 * fStack_190 +
                       fVar94 * fVar26 + fVar8 * fVar30 +
                       fVar93 * fStack_1a0 + fVar4 * fStack_1f0 + fVar11 + fVar7 * fStack_1b0 +
                       fVar9 * fStack_140;
                  *(float *)(pauVar48[-4] + 0xc) =
                       fVar5 * fStack_ec + fVar6 * fStack_1bc + fVar92 * fStack_18c +
                       fVar94 * fVar27 + fVar8 * fVar31 +
                       fVar93 * fStack_19c + fVar4 * fStack_1ec + fVar12 + fVar7 * fStack_1ac +
                       fVar9 * fStack_13c;
                  *(float *)pauVar47[-4] =
                       fVar6 * fVar85 + fVar5 * local_1d8 + fVar92 * fVar89 + fVar94 * local_138 +
                       fVar8 * local_c8 +
                       fVar9 * local_b8 +
                       fVar93 * fVar33 + fVar4 * local_e8 + fVar13 + fVar7 * local_108;
                  *(float *)(pauVar47[-4] + 4) =
                       fVar6 * fVar86 + fVar5 * fStack_1d4 + fVar92 * fVar90 + fVar94 * fStack_134 +
                       fVar8 * fStack_c4 +
                       fVar9 * fStack_b4 +
                       fVar93 * fVar34 + fVar4 * fStack_e4 + fVar14 + fVar7 * fStack_104;
                  *(float *)(pauVar47[-4] + 8) =
                       fVar6 * fVar87 + fVar5 * fStack_1d0 + fVar92 * fVar91 + fVar94 * fStack_130 +
                       fVar8 * fStack_c0 +
                       fVar9 * fStack_b0 +
                       fVar93 * fVar35 + fVar4 * fStack_e0 + fVar80 + fVar7 * fStack_100;
                  *(float *)(pauVar47[-4] + 0xc) =
                       fVar6 * fVar88 + fVar5 * fStack_1cc + fVar92 * fVar32 + fVar94 * fStack_12c +
                       fVar8 * fStack_bc +
                       fVar9 * fStack_ac +
                       fVar93 * fVar36 + fVar4 * fStack_dc + fVar81 + fVar7 * fStack_fc;
                  fVar4 = *(float *)((long)pvVar52 + lVar68 + 0xc);
                  fVar92 = *(float *)((long)pvVar69 + lVar68 + 0xc);
                  fVar7 = *(float *)((long)pvVar66 + lVar68 + 0xc);
                  fVar10 = *(float *)(pauVar48[-3] + 4);
                  fVar11 = *(float *)(pauVar48[-3] + 8);
                  fVar12 = *(float *)(pauVar48[-3] + 0xc);
                  fVar13 = *(float *)pauVar47[-3];
                  fVar14 = *(float *)(pauVar47[-3] + 4);
                  fVar80 = *(float *)(pauVar47[-3] + 8);
                  fVar81 = *(float *)(pauVar47[-3] + 0xc);
                  *(float *)pauVar48[-3] =
                       fVar6 * local_f8 + fVar5 * local_1f8 +
                       fVar94 * local_1a8 + fVar93 * local_198 + fVar8 * local_1b8 +
                       *(float *)pauVar48[-3] +
                       fVar4 * local_1c8 + fVar9 * fVar28 + fVar92 * fVar24 + fVar7 * local_148;
                  *(float *)(pauVar48[-3] + 4) =
                       fVar6 * fStack_f4 + fVar5 * fStack_1f4 +
                       fVar94 * fStack_1a4 + fVar93 * fStack_194 + fVar8 * fStack_1b4 + fVar10 +
                       fVar4 * fStack_1c4 + fVar9 * fVar29 + fVar92 * fVar25 + fVar7 * fStack_144;
                  *(float *)(pauVar48[-3] + 8) =
                       fVar6 * fStack_f0 + fVar5 * fStack_1f0 +
                       fVar94 * fStack_1a0 + fVar93 * fStack_190 + fVar8 * fStack_1b0 + fVar11 +
                       fVar4 * fStack_1c0 + fVar9 * fVar30 + fVar92 * fVar26 + fVar7 * fStack_140;
                  *(float *)(pauVar48[-3] + 0xc) =
                       fVar6 * fStack_ec + fVar5 * fStack_1ec +
                       fVar94 * fStack_19c + fVar93 * fStack_18c + fVar8 * fStack_1ac + fVar12 +
                       fVar4 * fStack_1bc + fVar9 * fVar31 + fVar92 * fVar27 + fVar7 * fStack_13c;
                  *(float *)pauVar47[-3] =
                       fVar6 * local_1d8 + fVar5 * local_e8 + fVar93 * fVar89 + fVar94 * fVar33 +
                       fVar8 * local_108 + fVar9 * local_c8 + fVar13 +
                       fVar4 * fVar85 + fVar92 * local_138 + fVar7 * local_b8;
                  *(float *)(pauVar47[-3] + 4) =
                       fVar6 * fStack_1d4 + fVar5 * fStack_e4 + fVar93 * fVar90 + fVar94 * fVar34 +
                       fVar8 * fStack_104 + fVar9 * fStack_c4 + fVar14 +
                       fVar4 * fVar86 + fVar92 * fStack_134 + fVar7 * fStack_b4;
                  *(float *)(pauVar47[-3] + 8) =
                       fVar6 * fStack_1d0 + fVar5 * fStack_e0 + fVar93 * fVar91 + fVar94 * fVar35 +
                       fVar8 * fStack_100 + fVar9 * fStack_c0 + fVar80 +
                       fVar4 * fVar87 + fVar92 * fStack_130 + fVar7 * fStack_b0;
                  *(float *)(pauVar47[-3] + 0xc) =
                       fVar6 * fStack_1cc + fVar5 * fStack_dc + fVar93 * fVar32 + fVar94 * fVar36 +
                       fVar8 * fStack_fc + fVar9 * fStack_bc + fVar81 +
                       fVar4 * fVar88 + fVar92 * fStack_12c + fVar7 * fStack_ac;
                  fVar5 = *(float *)((long)pvVar52 + lVar68 + 0x10);
                  fVar93 = *(float *)((long)pvVar69 + lVar68 + 0x10);
                  fVar8 = *(float *)((long)pvVar66 + lVar68 + 0x10);
                  fVar10 = *(float *)(pauVar48[-2] + 4);
                  fVar11 = *(float *)(pauVar48[-2] + 8);
                  fVar12 = *(float *)(pauVar48[-2] + 0xc);
                  fVar13 = *(float *)pauVar47[-2];
                  fVar14 = *(float *)(pauVar47[-2] + 4);
                  fVar80 = *(float *)(pauVar47[-2] + 8);
                  fVar81 = *(float *)(pauVar47[-2] + 0xc);
                  *(float *)pauVar48[-2] =
                       fVar94 * local_198 + fVar6 * local_1f8 + fVar9 * local_1b8 + fVar4 * local_f8
                       + fVar92 * local_1a8 + *(float *)pauVar48[-2] +
                       fVar7 * fVar28 + fVar5 * local_1c8 + fVar93 * auVar45._0_4_ +
                       local_148 * fVar8;
                  *(float *)(pauVar48[-2] + 4) =
                       fVar94 * fStack_194 + fVar6 * fStack_1f4 +
                       fVar9 * fStack_1b4 + fVar4 * fStack_f4 + fVar92 * fStack_1a4 + fVar10 +
                       fVar7 * fVar29 + fVar5 * fStack_1c4 + fVar93 * auVar45._4_4_ +
                       fStack_144 * fVar8;
                  *(float *)(pauVar48[-2] + 8) =
                       fVar94 * fStack_190 + fVar6 * fStack_1f0 +
                       fVar9 * fStack_1b0 + fVar4 * fStack_f0 + fVar92 * fStack_1a0 + fVar11 +
                       fVar7 * fVar30 + fVar5 * fStack_1c0 + fVar93 * auVar45._8_4_ +
                       fStack_140 * fVar8;
                  *(float *)(pauVar48[-2] + 0xc) =
                       fVar94 * fStack_18c + fVar6 * fStack_1ec +
                       fVar9 * fStack_1ac + fVar4 * fStack_ec + fVar92 * fStack_19c + fVar12 +
                       fVar7 * fVar31 + fVar5 * fStack_1bc + fVar93 * fVar27 + fStack_13c * fVar8;
                  *(float *)pauVar47[-2] =
                       fVar5 * fVar85 + fVar93 * local_138 + local_b8 * fVar8 +
                       fVar92 * fVar33 + local_c8 * fVar7 +
                       fVar6 * local_e8 + fVar94 * fVar89 + fVar4 * fVar37 + fVar9 * local_108 +
                       fVar13;
                  *(float *)(pauVar47[-2] + 4) =
                       fVar5 * fVar86 + fVar93 * fStack_134 + fStack_b4 * fVar8 +
                       fVar92 * fVar34 + fStack_c4 * fVar7 +
                       fVar6 * fStack_e4 + fVar94 * fVar90 + fVar4 * fStack_1d4 + fVar9 * fStack_104
                       + fVar14;
                  *(float *)(pauVar47[-2] + 8) =
                       fVar5 * fVar87 + fVar93 * fStack_130 + fStack_b0 * fVar8 +
                       fVar92 * fVar35 + fStack_c0 * fVar7 +
                       fVar6 * fStack_e0 + fVar94 * fVar91 + fVar4 * fStack_1d0 + fVar9 * fStack_100
                       + fVar80;
                  *(float *)(pauVar47[-2] + 0xc) =
                       fVar5 * fVar88 + fVar93 * fStack_12c + fStack_ac * fVar8 +
                       fVar92 * fVar36 + fStack_bc * fVar7 +
                       fVar6 * fStack_dc + fVar94 * fVar32 + fVar4 * fStack_1cc + fVar9 * fStack_fc
                       + fVar81;
                  fVar6 = *(float *)((long)pvVar52 + lVar68 + 0x14);
                  fVar94 = *(float *)((long)pvVar69 + lVar68 + 0x14);
                  fVar9 = *(float *)((long)pvVar66 + lVar68 + 0x14);
                  auVar78._0_4_ =
                       fVar93 * local_1a8 + fVar8 * fVar28 +
                       fVar7 * local_1b8 + fVar5 * local_f8 + fVar92 * local_198 + fVar4 * local_1f8
                       + *(float *)pauVar48[-1] +
                       fVar94 * auVar45._0_4_ + fVar6 * local_1c8 + fVar9 * local_148;
                  auVar78._4_4_ =
                       fVar93 * fStack_1a4 + fVar8 * fVar29 +
                       fVar7 * fStack_1b4 + fVar5 * fStack_f4 +
                       fVar92 * fStack_194 + fVar4 * fStack_1f4 + *(float *)(pauVar48[-1] + 4) +
                       fVar94 * auVar45._4_4_ + fVar6 * fStack_1c4 + fVar9 * fStack_144;
                  auVar78._8_4_ =
                       fVar93 * fStack_1a0 + fVar8 * fVar30 +
                       fVar7 * fStack_1b0 + fVar5 * fStack_f0 +
                       fVar92 * fStack_190 + fVar4 * fStack_1f0 + *(float *)(pauVar48[-1] + 8) +
                       fVar94 * auVar45._8_4_ + fVar6 * fStack_1c0 + fVar9 * fStack_140;
                  auVar78._12_4_ =
                       fVar93 * fStack_19c + fVar8 * fVar31 +
                       fVar7 * fStack_1ac + fVar5 * fStack_ec +
                       fVar92 * fStack_18c + fVar4 * fStack_1ec + *(float *)(pauVar48[-1] + 0xc) +
                       fVar94 * fVar27 + fVar6 * fStack_1bc + fVar9 * fStack_13c;
                  auVar75._0_4_ =
                       fVar92 * fVar89 + fVar4 * local_e8 + fVar5 * fVar37 + fVar7 * local_108 +
                       fVar93 * fVar33 + fVar8 * local_c8 + fVar6 * fVar85 + *(float *)pauVar47[-1]
                       + fVar94 * local_138 + fVar9 * local_b8;
                  auVar75._4_4_ =
                       fVar92 * fVar90 + fVar4 * fStack_e4 + fVar5 * fStack_1d4 + fVar7 * fStack_104
                       + fVar93 * fVar34 + fVar8 * fStack_c4 + fVar6 * fVar86 +
                       *(float *)(pauVar47[-1] + 4) + fVar94 * fStack_134 + fVar9 * fStack_b4;
                  auVar75._8_4_ =
                       fVar92 * fVar91 + fVar4 * fStack_e0 + fVar5 * fStack_1d0 + fVar7 * fStack_100
                       + fVar93 * fVar35 + fVar8 * fStack_c0 + fVar6 * fVar87 +
                       *(float *)(pauVar47[-1] + 8) + fVar94 * fStack_130 + fVar9 * fStack_b0;
                  auVar75._12_4_ =
                       fVar92 * fVar32 + fVar4 * fStack_dc + fVar5 * fStack_1cc + fVar7 * fStack_fc
                       + fVar93 * fVar36 + fVar8 * fStack_bc + fVar6 * fVar88 +
                       *(float *)(pauVar47[-1] + 0xc) + fVar94 * fStack_12c + fVar9 * fStack_ac;
                  pauVar48[-1] = auVar78;
                  pauVar47[-1] = auVar75;
                  lVar68 = lVar68 + 0x10;
                  iVar60 = iVar60 + 4;
                } while (iVar60 < (int)uVar20);
                pauVar59 = pauVar64 + 4;
                pauVar58 = pauVar56 + 4;
                pvVar52 = (void *)((long)pvVar52 + lVar68);
                pvVar69 = (void *)((long)pvVar69 + lVar68);
                pvVar66 = (void *)((long)pvVar66 + lVar68);
                auVar83 = ZEXT1664(auVar72);
                auVar95 = ZEXT1664(auVar18);
                uVar55 = uVar20 & 0xfffffffc;
              }
              if ((int)(uVar55 | 1) < (int)uVar20) {
                lVar68 = 0;
                pauVar48 = pauVar59;
                pauVar47 = pauVar58;
                uVar54 = uVar55;
                do {
                  pauVar64 = pauVar47;
                  pauVar56 = pauVar48;
                  fVar4 = *(float *)((long)pvVar52 + lVar68);
                  fVar5 = *(float *)((long)pvVar52 + lVar68 + 4);
                  fVar6 = *(float *)((long)pvVar52 + lVar68 + 8);
                  fVar92 = *(float *)((long)pvVar69 + lVar68);
                  fVar93 = *(float *)((long)pvVar69 + lVar68 + 4);
                  fVar94 = *(float *)((long)pvVar69 + lVar68 + 8);
                  fVar7 = *(float *)((long)pvVar66 + lVar68);
                  pauVar48 = (undefined1 (*) [16])(pauVar59[2] + lVar68 * 4);
                  fVar10 = *(float *)(pauVar48[-2] + 4);
                  fVar11 = *(float *)(pauVar48[-2] + 8);
                  fVar12 = *(float *)(pauVar48[-2] + 0xc);
                  fVar8 = *(float *)((long)pvVar66 + lVar68 + 4);
                  pauVar47 = (undefined1 (*) [16])(pauVar58[2] + lVar68 * 4);
                  fVar13 = *(float *)pauVar47[-2];
                  fVar14 = *(float *)(pauVar47[-2] + 4);
                  fVar80 = *(float *)(pauVar47[-2] + 8);
                  fVar81 = *(float *)(pauVar47[-2] + 0xc);
                  fVar9 = *(float *)((long)pvVar66 + lVar68 + 8);
                  *(float *)pauVar48[-2] =
                       fVar4 * local_1f8 + *(float *)pauVar48[-2] + local_1a8 * fVar93 +
                       fVar7 * local_1b8 + fVar9 * local_148 +
                       auVar40._0_4_ * fVar5 + fVar6 * local_1c8 + fVar92 * local_198 +
                       fVar94 * fVar24 + fVar8 * fVar28;
                  *(float *)(pauVar48[-2] + 4) =
                       fVar4 * fStack_1f4 + fVar10 + fStack_1a4 * fVar93 + fVar7 * fStack_1b4 +
                       fVar9 * fStack_144 +
                       auVar40._4_4_ * fVar5 + fVar6 * fStack_1c4 + fVar92 * fStack_194 +
                       fVar94 * fVar25 + fVar8 * fVar29;
                  *(float *)(pauVar48[-2] + 8) =
                       fVar4 * fStack_1f0 + fVar11 + fStack_1a0 * fVar93 + fVar7 * fStack_1b0 +
                       fVar9 * fStack_140 +
                       auVar40._8_4_ * fVar5 + fVar6 * fStack_1c0 + fVar92 * fStack_190 +
                       fVar94 * fVar26 + fVar8 * fVar30;
                  *(float *)(pauVar48[-2] + 0xc) =
                       fVar4 * fStack_1ec + fVar12 + fStack_19c * fVar93 + fVar7 * fStack_1ac +
                       fVar9 * fStack_13c +
                       fStack_ec * fVar5 + fVar6 * fStack_1bc + fVar92 * fStack_18c +
                       fVar94 * fVar27 + fVar8 * fVar31;
                  *(float *)pauVar47[-2] =
                       fVar4 * local_e8 + fVar13 + fVar33 * fVar93 + fVar7 * local_108 +
                       fVar9 * auVar41._0_4_ +
                       fVar94 * local_138 + fVar5 * fVar37 + fVar6 * fVar85 + fVar92 * fVar89 +
                       fVar8 * local_c8;
                  *(float *)(pauVar47[-2] + 4) =
                       fVar4 * fStack_e4 + fVar14 + fVar34 * fVar93 + fVar7 * fStack_104 +
                       fVar9 * auVar41._4_4_ +
                       fVar94 * fStack_134 + fVar5 * fStack_1d4 + fVar6 * fVar86 + fVar92 * fVar90 +
                       fVar8 * fStack_c4;
                  *(float *)(pauVar47[-2] + 8) =
                       fVar4 * fStack_e0 + fVar80 + fVar35 * fVar93 + fVar7 * fStack_100 +
                       fVar9 * auVar41._8_4_ +
                       fVar94 * fStack_130 + fVar5 * fStack_1d0 + fVar6 * fVar87 + fVar92 * fVar91 +
                       fVar8 * fStack_c0;
                  *(float *)(pauVar47[-2] + 0xc) =
                       fVar4 * fStack_dc + fVar81 + fVar36 * fVar93 + fVar7 * fStack_fc +
                       fVar9 * fStack_ac +
                       fVar94 * fStack_12c + fVar5 * fStack_1cc + fVar6 * fVar88 + fVar92 * fVar32 +
                       fVar8 * fStack_bc;
                  fVar4 = *(float *)((long)pvVar52 + lVar68 + 0xc);
                  fVar92 = *(float *)((long)pvVar69 + lVar68 + 0xc);
                  fVar7 = *(float *)((long)pvVar66 + lVar68 + 0xc);
                  auVar79._0_4_ =
                       auVar40._0_4_ * fVar6 + fVar5 * local_1f8 +
                       fVar93 * local_198 + local_1a8 * fVar94 + fVar8 * local_1b8 +
                       *(float *)pauVar48[-1] +
                       fVar9 * fVar28 + fVar4 * local_1c8 + fVar92 * fVar24 + fVar7 * local_148;
                  auVar79._4_4_ =
                       auVar40._4_4_ * fVar6 + fVar5 * fStack_1f4 +
                       fVar93 * fStack_194 + fStack_1a4 * fVar94 + fVar8 * fStack_1b4 +
                       *(float *)(pauVar48[-1] + 4) +
                       fVar9 * fVar29 + fVar4 * fStack_1c4 + fVar92 * fVar25 + fVar7 * fStack_144;
                  auVar79._8_4_ =
                       auVar40._8_4_ * fVar6 + fVar5 * fStack_1f0 +
                       fVar93 * fStack_190 + fStack_1a0 * fVar94 + fVar8 * fStack_1b0 +
                       *(float *)(pauVar48[-1] + 8) +
                       fVar9 * fVar30 + fVar4 * fStack_1c0 + fVar92 * fVar26 + fVar7 * fStack_140;
                  auVar79._12_4_ =
                       fStack_ec * fVar6 + fVar5 * fStack_1ec +
                       fVar93 * fStack_18c + fStack_19c * fVar94 + fVar8 * fStack_1ac +
                       *(float *)(pauVar48[-1] + 0xc) +
                       fVar9 * fVar31 + fVar4 * fStack_1bc + fVar92 * fVar27 + fVar7 * fStack_13c;
                  auVar76._0_4_ =
                       fVar6 * fVar37 + fVar5 * local_e8 + fVar93 * fVar89 + fVar33 * fVar94 +
                       fVar8 * local_108 + fVar9 * local_c8 + *(float *)pauVar47[-1] +
                       fVar4 * fVar85 + fVar92 * local_138 + fVar7 * auVar41._0_4_;
                  auVar76._4_4_ =
                       fVar6 * fStack_1d4 + fVar5 * fStack_e4 + fVar93 * fVar90 + fVar34 * fVar94 +
                       fVar8 * fStack_104 + fVar9 * fStack_c4 + *(float *)(pauVar47[-1] + 4) +
                       fVar4 * fVar86 + fVar92 * fStack_134 + fVar7 * auVar41._4_4_;
                  auVar76._8_4_ =
                       fVar6 * fStack_1d0 + fVar5 * fStack_e0 + fVar93 * fVar91 + fVar35 * fVar94 +
                       fVar8 * fStack_100 + fVar9 * fStack_c0 + *(float *)(pauVar47[-1] + 8) +
                       fVar4 * fVar87 + fVar92 * fStack_130 + fVar7 * auVar41._8_4_;
                  auVar76._12_4_ =
                       fVar6 * fStack_1cc + fVar5 * fStack_dc + fVar93 * fVar32 + fVar36 * fVar94 +
                       fVar8 * fStack_fc + fVar9 * fStack_bc + *(float *)(pauVar47[-1] + 0xc) +
                       fVar4 * fVar88 + fVar92 * fStack_12c + fVar7 * fStack_ac;
                  pauVar48[-1] = auVar79;
                  pauVar47[-1] = auVar76;
                  uVar55 = uVar54 + 2;
                  lVar68 = lVar68 + 8;
                  iVar60 = uVar54 + 3;
                  uVar54 = uVar55;
                } while (iVar60 < (int)uVar20);
                pauVar59 = pauVar56 + 2;
                pauVar58 = pauVar64 + 2;
                pvVar52 = (void *)((long)pvVar52 + lVar68);
                pvVar69 = (void *)((long)pvVar69 + lVar68);
                pvVar66 = (void *)((long)pvVar66 + lVar68);
                auVar83 = ZEXT1664(auVar72);
                auVar95 = ZEXT1664(auVar18);
              }
              auVar46 = *pauVar1;
              iVar60 = uVar20 - uVar55;
              if (iVar60 != 0 && (int)uVar55 <= (int)uVar20) {
                lVar68 = 0;
                lVar51 = 0;
                auVar84 = auVar83;
                do {
                  fVar4 = *(float *)((long)pvVar52 + lVar68);
                  fVar5 = *(float *)((long)pvVar52 + lVar68 + 4);
                  fVar6 = *(float *)((long)pvVar52 + lVar68 + 8);
                  fVar92 = *(float *)((long)pvVar69 + lVar68);
                  fVar93 = *(float *)((long)pvVar69 + lVar68 + 4);
                  fVar94 = *(float *)((long)pvVar69 + lVar68 + 8);
                  fVar7 = *(float *)((long)pvVar66 + lVar68);
                  fVar8 = *(float *)((long)pvVar66 + lVar68 + 4);
                  fVar9 = *(float *)((long)pvVar66 + lVar68 + 8);
                  pfVar3 = (float *)((long)*pauVar59 + lVar68 * 4);
                  fVar10 = pfVar3[1];
                  fVar11 = pfVar3[2];
                  fVar12 = pfVar3[3];
                  auVar83 = ZEXT1664(auVar84._0_16_);
                  pfVar2 = (float *)((long)*pauVar58 + lVar68 * 4);
                  auVar77._0_4_ =
                       fVar93 * fVar33 + fVar4 * auVar84._0_4_ + *pfVar2 + fVar7 * local_108 +
                       fVar9 * auVar42._0_4_ +
                       fVar92 * fVar89 + fVar6 * fVar85 + fVar5 * fVar37 + fVar94 * local_138 +
                       auVar95._0_4_ * fVar8;
                  auVar77._4_4_ =
                       fVar93 * fVar34 + fVar4 * auVar84._4_4_ + pfVar2[1] + fVar7 * fStack_104 +
                       fVar9 * auVar42._4_4_ +
                       fVar92 * fVar90 + fVar6 * fVar86 + fVar5 * fStack_1d4 + fVar94 * fStack_134 +
                       auVar95._4_4_ * fVar8;
                  auVar77._8_4_ =
                       fVar93 * fVar35 + fVar4 * auVar84._8_4_ + pfVar2[2] + fVar7 * fStack_100 +
                       fVar9 * auVar42._8_4_ +
                       fVar92 * fVar91 + fVar6 * fVar87 + fVar5 * fStack_1d0 + fVar94 * fStack_130 +
                       auVar95._8_4_ * fVar8;
                  auVar77._12_4_ =
                       fVar93 * fVar36 + fVar4 * auVar84._12_4_ + pfVar2[3] + fVar7 * fStack_fc +
                       fVar9 * fStack_ac +
                       fVar92 * fVar32 + fVar6 * fVar88 + fVar5 * fStack_1cc + fVar94 * fStack_12c +
                       auVar95._12_4_ * fVar8;
                  pfVar2 = (float *)((long)*pauVar59 + lVar68 * 4);
                  *pfVar2 = fVar4 * local_1f8 + *pfVar3 + fVar93 * local_1a8 + fVar7 * local_1b8 +
                            fVar9 * local_148 +
                            auVar46._0_4_ * fVar5 + fVar6 * local_1c8 + fVar92 * local_198 +
                            fVar94 * fVar24 + fVar8 * fVar28;
                  pfVar2[1] = fVar4 * fStack_1f4 + fVar10 + fVar93 * fStack_1a4 + fVar7 * fStack_1b4
                              + fVar9 * fStack_144 +
                              auVar46._4_4_ * fVar5 + fVar6 * fStack_1c4 + fVar92 * fStack_194 +
                              fVar94 * fVar25 + fVar8 * fVar29;
                  pfVar2[2] = fVar4 * fStack_1f0 + fVar11 + fVar93 * fStack_1a0 + fVar7 * fStack_1b0
                              + fVar9 * fStack_140 +
                              auVar46._8_4_ * fVar5 + fVar6 * fStack_1c0 + fVar92 * fStack_190 +
                              fVar94 * fVar26 + fVar8 * fVar30;
                  pfVar2[3] = fVar4 * fStack_1ec + fVar12 + fVar93 * fStack_19c + fVar7 * fStack_1ac
                              + fVar9 * fStack_13c +
                              fStack_ec * fVar5 + fVar6 * fStack_1bc + fVar92 * fStack_18c +
                              fVar94 * fVar27 + fVar8 * fVar31;
                  *(undefined1 (*) [16])((long)*pauVar58 + lVar68 * 4) = auVar77;
                  lVar51 = lVar51 + -0x10;
                  lVar68 = lVar68 + 4;
                  iVar60 = iVar60 + -1;
                  auVar84 = auVar83;
                } while (iVar60 != 0);
                pauVar59 = (undefined1 (*) [16])((long)pauVar59 - lVar51);
                pauVar58 = (undefined1 (*) [16])((long)pauVar58 - lVar51);
                pvVar52 = (void *)((long)pvVar52 + lVar68);
                pvVar69 = (void *)((long)pvVar69 + lVar68);
                pvVar66 = (void *)((long)pvVar66 + lVar68);
                auVar95 = ZEXT1664(auVar95._0_16_);
              }
              pvVar52 = (void *)((long)pvVar52 + 8);
              pvVar69 = (void *)((long)pvVar69 + 8);
              pvVar66 = (void *)((long)pvVar66 + 8);
              iVar53 = iVar53 + 1;
            } while (iVar53 != iVar21);
          }
          local_78 = local_78 + 0x12;
          pauVar67 = pauVar67 + 9;
          local_d8 = local_d8 + 1;
        } while (local_d8 != uVar19);
      }
      uVar65 = uVar65 + 1;
    } while (uVar65 != (uint)(iVar22 >> 1));
  }
  if ((int)uVar57 != iVar22) {
    do {
      uVar63 = (long)top_blob->h * (long)top_blob->w;
      uVar65 = top_blob->elemsize;
      uVar49 = (uVar65 * uVar63 + 0xf & 0xfffffffffffffff0) / uVar65;
      if (top_blob->dims == 4) {
        uVar49 = uVar63;
      }
      if (pvVar23 == (void *)0x0) {
        auVar71 = ZEXT816(0) << 0x40;
      }
      else {
        auVar71 = *(undefined1 (*) [16])((long)pvVar23 + uVar57 * 0x10);
      }
      pauVar62 = (undefined1 (*) [16])(top_blob->cstep * uVar57 * uVar65 + (long)top_blob->data);
      iVar53 = (int)uVar49 * top_blob->d;
      pauVar50 = pauVar62;
      if (0 < iVar53) {
        do {
          *pauVar50 = auVar71;
          iVar53 = iVar53 + -1;
          pauVar50 = pauVar50 + 1;
        } while (iVar53 != 0);
      }
      if (0 < (int)uVar19) {
        pauVar50 = (undefined1 (*) [16])
                   (kernel->cstep * uVar57 * kernel->elemsize + (long)kernel->data);
        uVar65 = 0;
        do {
          if (0 < iVar21) {
            auVar71 = *pauVar50;
            pauVar67 = pauVar50 + 1;
            fVar89 = *(float *)*pauVar67;
            fVar90 = *(float *)(pauVar50[1] + 4);
            fVar91 = *(float *)(pauVar50[1] + 8);
            auVar41 = *(undefined1 (*) [12])*pauVar67;
            fVar32 = *(float *)(pauVar50[1] + 0xc);
            auVar17 = *pauVar67;
            fVar37 = *(float *)pauVar50[2];
            fVar4 = *(float *)(pauVar50[2] + 4);
            uVar38 = *(undefined8 *)pauVar50[2];
            fVar5 = *(float *)(pauVar50[2] + 8);
            fVar6 = *(float *)(pauVar50[2] + 0xc);
            uVar39 = *(undefined8 *)(pauVar50[2] + 8);
            fVar28 = *(float *)pauVar50[3];
            fVar29 = *(float *)(pauVar50[3] + 4);
            fVar30 = *(float *)(pauVar50[3] + 8);
            auVar43 = *(undefined1 (*) [12])pauVar50[3];
            fVar31 = *(float *)(pauVar50[3] + 0xc);
            auVar70 = pauVar50[4];
            auVar15 = pauVar50[5];
            pauVar67 = pauVar50 + 6;
            fVar33 = *(float *)*pauVar67;
            fVar34 = *(float *)(pauVar50[6] + 4);
            fVar35 = *(float *)(pauVar50[6] + 8);
            auVar45 = *(undefined1 (*) [12])*pauVar67;
            auVar42 = *(undefined1 (*) [12])*pauVar67;
            fVar36 = *(float *)(pauVar50[6] + 0xc);
            pauVar67 = pauVar50 + 7;
            fVar85 = *(float *)*pauVar67;
            fVar86 = *(float *)(pauVar50[7] + 4);
            fVar87 = *(float *)(pauVar50[7] + 8);
            auVar40 = *(undefined1 (*) [12])*pauVar67;
            fVar88 = *(float *)(pauVar50[7] + 0xc);
            auVar16 = *pauVar67;
            fVar24 = *(float *)pauVar50[8];
            fVar25 = *(float *)(pauVar50[8] + 4);
            fVar26 = *(float *)(pauVar50[8] + 8);
            fVar27 = *(float *)(pauVar50[8] + 0xc);
            pvVar69 = (void *)(bottom_blob->cstep * uVar65 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar68 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar66 = (void *)((long)pvVar69 + lVar68 * 2);
            pvVar52 = (void *)(lVar68 + (long)pvVar69);
            iVar53 = 0;
            pauVar67 = pauVar62;
            fVar92 = fVar32;
            fVar93 = fVar37;
            fVar94 = fVar5;
            do {
              fStack_1a4 = auVar17._4_4_;
              fStack_1a0 = auVar17._8_4_;
              fStack_19c = auVar17._12_4_;
              local_1f8 = (float)uVar38;
              fStack_1f0 = (float)uVar39;
              fStack_1b4 = auVar71._4_4_;
              fStack_1b0 = auVar71._8_4_;
              fStack_1ac = auVar71._12_4_;
              local_1c8 = auVar15._0_4_;
              fStack_1c4 = auVar15._4_4_;
              fStack_1c0 = auVar15._8_4_;
              fStack_1bc = auVar15._12_4_;
              local_198 = auVar16._0_4_;
              fVar9 = local_198;
              fStack_194 = auVar16._4_4_;
              fStack_190 = auVar16._8_4_;
              fStack_18c = auVar16._12_4_;
              fVar7 = auVar41._4_4_;
              fVar8 = auVar41._8_4_;
              local_1b8 = auVar71._0_4_;
              local_1d8 = auVar70._0_4_;
              fStack_1d4 = auVar70._4_4_;
              fStack_1d0 = auVar70._8_4_;
              fStack_1cc = auVar70._12_4_;
              local_1a8 = auVar41._0_4_;
              if ((int)uVar20 < 4) {
                uVar55 = 0;
                pauVar58 = pauVar67;
              }
              else {
                iVar60 = 3;
                lVar68 = 0;
                pauVar58 = pauVar67;
                do {
                  pauVar59 = pauVar58;
                  fVar85 = *(float *)((long)pvVar69 + lVar68);
                  fVar86 = *(float *)((long)pvVar69 + lVar68 + 4);
                  fVar87 = *(float *)((long)pvVar69 + lVar68 + 8);
                  fVar88 = *(float *)((long)pvVar52 + lVar68);
                  fVar89 = *(float *)((long)pvVar52 + lVar68 + 4);
                  fVar90 = *(float *)((long)pvVar52 + lVar68 + 8);
                  fVar91 = *(float *)((long)pvVar66 + lVar68);
                  fVar92 = *(float *)((long)pvVar66 + lVar68 + 4);
                  fVar93 = *(float *)((long)pvVar66 + lVar68 + 8);
                  pauVar58 = (undefined1 (*) [16])(pauVar67[4] + lVar68 * 4);
                  fVar12 = *(float *)(pauVar58[-4] + 4);
                  fVar13 = *(float *)(pauVar58[-4] + 8);
                  fVar14 = *(float *)(pauVar58[-4] + 0xc);
                  fVar80 = auVar42._0_4_;
                  fVar81 = auVar42._4_4_;
                  fVar82 = auVar42._8_4_;
                  local_198 = auVar40._0_4_;
                  fVar94 = *(float *)((long)pvVar69 + lVar68 + 0xc);
                  fVar10 = *(float *)((long)pvVar52 + lVar68 + 0xc);
                  fVar11 = *(float *)((long)pvVar66 + lVar68 + 0xc);
                  *(float *)pauVar58[-4] =
                       fVar85 * local_1b8 + *(float *)pauVar58[-4] + fVar89 * local_1d8 +
                       fVar80 * fVar91 + fVar93 * fVar24 +
                       fVar92 * local_198 +
                       fVar90 * local_1c8 + fVar88 * fVar28 + fVar86 * local_1a8 + fVar87 * fVar37;
                  *(float *)(pauVar58[-4] + 4) =
                       fVar85 * fStack_1b4 + fVar12 + fVar89 * fStack_1d4 + fVar81 * fVar91 +
                       fVar93 * fVar25 +
                       fVar92 * fStack_194 +
                       fVar90 * fStack_1c4 + fVar88 * fVar29 + fVar86 * fStack_1a4 + fVar87 * fVar4;
                  *(float *)(pauVar58[-4] + 8) =
                       fVar85 * fStack_1b0 + fVar13 + fVar89 * fStack_1d0 + fVar82 * fVar91 +
                       fVar93 * fVar26 +
                       fVar92 * fStack_190 +
                       fVar90 * fStack_1c0 + fVar88 * fVar30 + fVar86 * fStack_1a0 + fVar87 * fVar5;
                  *(float *)(pauVar58[-4] + 0xc) =
                       fVar85 * fStack_1ac + fVar14 + fVar89 * fStack_1cc + fVar36 * fVar91 +
                       fVar93 * fVar27 +
                       fVar92 * fStack_18c +
                       fVar90 * fStack_1bc + fVar88 * fVar31 + fVar86 * fStack_19c + fVar87 * fVar6;
                  fVar12 = *(float *)(pauVar58[-3] + 4);
                  fVar13 = *(float *)(pauVar58[-3] + 8);
                  fVar14 = *(float *)(pauVar58[-3] + 0xc);
                  fVar85 = *(float *)((long)pvVar69 + lVar68 + 0x10);
                  fVar88 = *(float *)((long)pvVar52 + lVar68 + 0x10);
                  fVar91 = *(float *)((long)pvVar66 + lVar68 + 0x10);
                  *(float *)pauVar58[-3] =
                       fVar87 * local_1a8 + fVar86 * local_1b8 +
                       fVar28 * fVar89 + fVar90 * local_1d8 + *(float *)pauVar58[-3] +
                       fVar11 * fVar24 +
                       fVar10 * local_1c8 + fVar93 * local_198 + fVar92 * fVar80 + fVar94 * fVar37;
                  *(float *)(pauVar58[-3] + 4) =
                       fVar87 * fStack_1a4 + fVar86 * fStack_1b4 +
                       fVar29 * fVar89 + fVar90 * fStack_1d4 + fVar12 +
                       fVar11 * fVar25 +
                       fVar10 * fStack_1c4 + fVar93 * fStack_194 + fVar92 * fVar81 + fVar94 * fVar4;
                  *(float *)(pauVar58[-3] + 8) =
                       fVar87 * fStack_1a0 + fVar86 * fStack_1b0 +
                       fVar30 * fVar89 + fVar90 * fStack_1d0 + fVar13 +
                       fVar11 * fVar26 +
                       fVar10 * fStack_1c0 + fVar93 * fStack_190 + fVar92 * fVar82 + fVar94 * fVar5;
                  *(float *)(pauVar58[-3] + 0xc) =
                       fVar87 * fStack_19c + fVar86 * fStack_1ac +
                       fVar31 * fVar89 + fVar90 * fStack_1cc + fVar14 +
                       fVar11 * fVar27 +
                       fVar10 * fStack_1bc + fVar93 * fStack_18c + fVar92 * fVar36 + fVar94 * fVar6;
                  fVar12 = *(float *)(pauVar58[-2] + 4);
                  fVar13 = *(float *)(pauVar58[-2] + 8);
                  fVar14 = *(float *)(pauVar58[-2] + 0xc);
                  fVar86 = *(float *)((long)pvVar69 + lVar68 + 0x14);
                  fVar89 = *(float *)((long)pvVar52 + lVar68 + 0x14);
                  fVar92 = *(float *)((long)pvVar66 + lVar68 + 0x14);
                  *(float *)pauVar58[-2] =
                       fVar10 * local_1d8 + fVar11 * local_198 + fVar85 * fVar37 +
                       fVar88 * local_1c8 + fVar91 * fVar24 +
                       fVar93 * fVar80 + fVar94 * local_1a8 + fVar90 * fVar28 + fVar87 * local_1b8 +
                       *(float *)pauVar58[-2];
                  *(float *)(pauVar58[-2] + 4) =
                       fVar10 * fStack_1d4 + fVar11 * fStack_194 + fVar85 * fVar4 +
                       fVar88 * fStack_1c4 + fVar91 * fVar25 +
                       fVar93 * fVar81 + fVar94 * fVar7 + fVar90 * fVar29 + fVar87 * fStack_1b4 +
                       fVar12;
                  *(float *)(pauVar58[-2] + 8) =
                       fVar10 * fStack_1d0 + fVar11 * fStack_190 + fVar85 * fVar5 +
                       fVar88 * fStack_1c0 + fVar91 * fVar26 +
                       fVar93 * fVar82 + fVar94 * fVar8 + fVar90 * fVar30 + fVar87 * fStack_1b0 +
                       fVar13;
                  *(float *)(pauVar58[-2] + 0xc) =
                       fVar10 * fStack_1cc + fVar11 * fStack_18c + fVar85 * fVar6 +
                       fVar88 * fStack_1bc + fVar91 * fVar27 +
                       fVar93 * fVar36 + fVar94 * fVar32 + fVar90 * fVar31 + fVar87 * fStack_1ac +
                       fVar14;
                  auVar72._0_4_ =
                       fVar28 * fVar10 + fVar94 * local_1b8 + fVar80 * fVar11 + fVar85 * local_1a8 +
                       *(float *)pauVar58[-1] +
                       fVar88 * local_1d8 + fVar91 * local_198 + fVar86 * local_1f8 +
                       fVar89 * local_1c8 + fVar92 * fVar24;
                  auVar72._4_4_ =
                       fVar29 * fVar10 + fVar94 * fStack_1b4 + fVar81 * fVar11 + fVar85 * fVar7 +
                       *(float *)(pauVar58[-1] + 4) +
                       fVar88 * fStack_1d4 + fVar91 * fStack_194 + fVar86 * fVar4 +
                       fVar89 * fStack_1c4 + fVar92 * fVar25;
                  auVar72._8_4_ =
                       fVar30 * fVar10 + fVar94 * fStack_1b0 + fVar82 * fVar11 + fVar85 * fVar8 +
                       *(float *)(pauVar58[-1] + 8) +
                       fVar88 * fStack_1d0 + fVar91 * fStack_190 + fVar86 * fStack_1f0 +
                       fVar89 * fStack_1c0 + fVar92 * fVar26;
                  auVar72._12_4_ =
                       fVar31 * fVar10 + fVar94 * fStack_1ac + fVar36 * fVar11 + fVar85 * fVar32 +
                       *(float *)(pauVar58[-1] + 0xc) +
                       fVar88 * fStack_1cc + fVar91 * fStack_18c + fVar86 * fVar6 +
                       fVar89 * fStack_1bc + fVar92 * fVar27;
                  pauVar58[-1] = auVar72;
                  lVar68 = lVar68 + 0x10;
                  iVar60 = iVar60 + 4;
                } while (iVar60 < (int)uVar20);
                pvVar69 = (void *)((long)pvVar69 + lVar68);
                pvVar52 = (void *)((long)pvVar52 + lVar68);
                pvVar66 = (void *)((long)pvVar66 + lVar68);
                pauVar58 = pauVar59 + 4;
                fVar85 = fVar9;
                fVar86 = fStack_194;
                fVar87 = fStack_190;
                fVar88 = fStack_18c;
                fVar89 = local_1a8;
                fVar90 = fStack_1a4;
                fVar91 = fStack_1a0;
                fVar92 = fStack_19c;
                fVar93 = local_1f8;
                fVar94 = fStack_1f0;
                uVar55 = uVar20 & 0xfffffffc;
              }
              if ((int)(uVar55 | 1) < (int)uVar20) {
                lVar68 = 0;
                pauVar67 = pauVar58;
                uVar54 = uVar55;
                do {
                  pauVar59 = pauVar67;
                  fVar85 = *(float *)((long)pvVar69 + lVar68);
                  fVar86 = *(float *)((long)pvVar69 + lVar68 + 4);
                  fVar87 = *(float *)((long)pvVar69 + lVar68 + 8);
                  fVar88 = *(float *)((long)pvVar52 + lVar68);
                  fVar89 = *(float *)((long)pvVar52 + lVar68 + 4);
                  fVar90 = *(float *)((long)pvVar52 + lVar68 + 8);
                  fVar91 = *(float *)((long)pvVar66 + lVar68);
                  fVar92 = *(float *)((long)pvVar66 + lVar68 + 4);
                  fVar93 = *(float *)((long)pvVar66 + lVar68 + 8);
                  pauVar67 = (undefined1 (*) [16])(pauVar58[2] + lVar68 * 4);
                  fVar12 = *(float *)(pauVar67[-2] + 4);
                  fVar13 = *(float *)(pauVar67[-2] + 8);
                  fVar14 = *(float *)(pauVar67[-2] + 0xc);
                  fVar94 = *(float *)((long)pvVar69 + lVar68 + 0xc);
                  fVar10 = *(float *)((long)pvVar52 + lVar68 + 0xc);
                  fVar11 = *(float *)((long)pvVar66 + lVar68 + 0xc);
                  *(float *)pauVar67[-2] =
                       fVar86 * local_1a8 + fVar87 * local_1f8 + fVar88 * auVar43._0_4_ +
                       local_1c8 * fVar90 + fVar92 * fVar9 +
                       fVar93 * fVar24 +
                       fVar91 * auVar45._0_4_ +
                       local_1d8 * fVar89 + fVar85 * local_1b8 + *(float *)pauVar67[-2];
                  *(float *)(pauVar67[-2] + 4) =
                       fVar86 * fVar7 + fVar87 * fVar4 + fVar88 * auVar43._4_4_ +
                       fStack_1c4 * fVar90 + fVar92 * fStack_194 +
                       fVar93 * fVar25 +
                       fVar91 * auVar45._4_4_ + fStack_1d4 * fVar89 + fVar85 * fStack_1b4 + fVar12;
                  *(float *)(pauVar67[-2] + 8) =
                       fVar86 * fVar8 + fVar87 * fStack_1f0 + fVar88 * auVar43._8_4_ +
                       fStack_1c0 * fVar90 + fVar92 * fStack_190 +
                       fVar93 * fVar26 +
                       fVar91 * auVar45._8_4_ + fStack_1d0 * fVar89 + fVar85 * fStack_1b0 + fVar13;
                  *(float *)(pauVar67[-2] + 0xc) =
                       fVar86 * fVar32 + fVar87 * fVar6 + fVar88 * fVar31 + fStack_1bc * fVar90 +
                       fVar92 * fStack_18c +
                       fVar93 * fVar27 +
                       fVar91 * fVar36 + fStack_1cc * fVar89 + fVar85 * fStack_1ac + fVar14;
                  auVar73._0_4_ =
                       fVar87 * local_1a8 + fVar86 * local_1b8 +
                       local_1d8 * fVar90 + auVar43._0_4_ * fVar89 + *(float *)pauVar67[-1] +
                       auVar45._0_4_ * fVar92 + fVar93 * fVar9 + fVar94 * local_1f8 +
                       fVar10 * local_1c8 + fVar24 * fVar11;
                  auVar73._4_4_ =
                       fVar87 * fVar7 + fVar86 * fStack_1b4 +
                       fStack_1d4 * fVar90 + auVar43._4_4_ * fVar89 + *(float *)(pauVar67[-1] + 4) +
                       auVar45._4_4_ * fVar92 + fVar93 * fStack_194 + fVar94 * fVar4 +
                       fVar10 * fStack_1c4 + fVar25 * fVar11;
                  auVar73._8_4_ =
                       fVar87 * fVar8 + fVar86 * fStack_1b0 +
                       fStack_1d0 * fVar90 + auVar43._8_4_ * fVar89 + *(float *)(pauVar67[-1] + 8) +
                       auVar45._8_4_ * fVar92 + fVar93 * fStack_190 + fVar94 * fStack_1f0 +
                       fVar10 * fStack_1c0 + fVar26 * fVar11;
                  auVar73._12_4_ =
                       fVar87 * fVar32 + fVar86 * fStack_1ac + fStack_1cc * fVar90 + fVar31 * fVar89
                       + *(float *)(pauVar67[-1] + 0xc) +
                       fVar36 * fVar92 + fVar93 * fStack_18c + fVar94 * fVar6 + fVar10 * fStack_1bc
                       + fVar27 * fVar11;
                  pauVar67[-1] = auVar73;
                  uVar55 = uVar54 + 2;
                  lVar68 = lVar68 + 8;
                  iVar60 = uVar54 + 3;
                  uVar54 = uVar55;
                } while (iVar60 < (int)uVar20);
                pauVar58 = pauVar59 + 2;
                pvVar69 = (void *)((long)pvVar69 + lVar68);
                pvVar52 = (void *)((long)pvVar52 + lVar68);
                pvVar66 = (void *)((long)pvVar66 + lVar68);
                fVar85 = fVar9;
                fVar86 = fStack_194;
                fVar87 = fStack_190;
                fVar88 = fStack_18c;
                fVar89 = local_1a8;
                fVar90 = fStack_1a4;
                fVar91 = fStack_1a0;
                fVar92 = fStack_19c;
                fVar93 = local_1f8;
                fVar94 = fStack_1f0;
              }
              iVar60 = uVar20 - uVar55;
              pauVar67 = pauVar58;
              if (iVar60 != 0 && (int)uVar55 <= (int)uVar20) {
                lVar68 = 0;
                do {
                  fVar7 = *(float *)((long)pvVar69 + lVar68);
                  fVar8 = *(float *)((long)pvVar69 + lVar68 + 4);
                  fVar9 = *(float *)((long)pvVar69 + lVar68 + 8);
                  fVar10 = *(float *)((long)pvVar52 + lVar68);
                  pfVar2 = (float *)((long)*pauVar58 + lVar68 * 4);
                  fVar11 = *(float *)((long)pvVar52 + lVar68 + 4);
                  fVar12 = *(float *)((long)pvVar52 + lVar68 + 8);
                  fVar13 = *(float *)((long)pvVar66 + lVar68);
                  fVar14 = *(float *)((long)pvVar66 + lVar68 + 4);
                  fVar80 = *(float *)((long)pvVar66 + lVar68 + 8);
                  auVar74._0_4_ =
                       local_1b8 * fVar7 + *pfVar2 + local_1d8 * fVar11 + fVar33 * fVar13 +
                       fVar80 * fVar24 +
                       fVar89 * fVar8 + fVar93 * fVar9 + fVar10 * fVar28 + local_1c8 * fVar12 +
                       fVar85 * fVar14;
                  auVar74._4_4_ =
                       fStack_1b4 * fVar7 + pfVar2[1] + fStack_1d4 * fVar11 + fVar34 * fVar13 +
                       fVar80 * fVar25 +
                       fVar90 * fVar8 + fVar4 * fVar9 + fVar10 * fVar29 + fStack_1c4 * fVar12 +
                       fVar86 * fVar14;
                  auVar74._8_4_ =
                       fStack_1b0 * fVar7 + pfVar2[2] + fStack_1d0 * fVar11 + fVar35 * fVar13 +
                       fVar80 * fVar26 +
                       fVar91 * fVar8 + fVar94 * fVar9 + fVar10 * fVar30 + fStack_1c0 * fVar12 +
                       fVar87 * fVar14;
                  auVar74._12_4_ =
                       fStack_1ac * fVar7 + pfVar2[3] + fStack_1cc * fVar11 + fVar36 * fVar13 +
                       fVar80 * fVar27 +
                       fVar92 * fVar8 + fVar6 * fVar9 + fVar10 * fVar31 + fStack_1bc * fVar12 +
                       fVar88 * fVar14;
                  *(undefined1 (*) [16])((long)*pauVar58 + lVar68 * 4) = auVar74;
                  pauVar67 = pauVar67 + 1;
                  lVar68 = lVar68 + 4;
                  iVar60 = iVar60 + -1;
                } while (iVar60 != 0);
                pvVar69 = (void *)((long)pvVar69 + lVar68);
                pvVar52 = (void *)((long)pvVar52 + lVar68);
                pvVar66 = (void *)((long)pvVar66 + lVar68);
              }
              pvVar69 = (void *)((long)pvVar69 + 8);
              pvVar52 = (void *)((long)pvVar52 + 8);
              pvVar66 = (void *)((long)pvVar66 + 8);
              iVar53 = iVar53 + 1;
            } while (iVar53 != iVar21);
          }
          pauVar50 = pauVar50 + 9;
          uVar65 = uVar65 + 1;
        } while (uVar65 != uVar19);
      }
      uVar57 = uVar57 + 1;
    } while ((long)uVar57 < (long)iVar22);
  }
  return;
}

Assistant:

static void conv3x3s1_pack1to4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    int nn_outch = outch >> 1;
    int remain_outch_start = nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        Mat out0 = top_blob.channel(p);
        Mat out1 = top_blob.channel(p + 1);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        __m128 _bias1 = bias ? _mm_loadu_ps((const float*)bias + (p + 1) * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);
        out1.fill(_bias1);

        const float* k0 = kernel.channel(p);
        const float* k1 = kernel.channel(p + 1);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0;
            float* outptr1 = out1;

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00_0 = _mm_loadu_ps(k0);
            __m128 _k01_0 = _mm_loadu_ps(k0 + 4);
            __m128 _k02_0 = _mm_loadu_ps(k0 + 8);
            __m128 _k10_0 = _mm_loadu_ps(k0 + 12);
            __m128 _k11_0 = _mm_loadu_ps(k0 + 16);
            __m128 _k12_0 = _mm_loadu_ps(k0 + 20);
            __m128 _k20_0 = _mm_loadu_ps(k0 + 24);
            __m128 _k21_0 = _mm_loadu_ps(k0 + 28);
            __m128 _k22_0 = _mm_loadu_ps(k0 + 32);

            __m128 _k00_1 = _mm_loadu_ps(k1);
            __m128 _k01_1 = _mm_loadu_ps(k1 + 4);
            __m128 _k02_1 = _mm_loadu_ps(k1 + 8);
            __m128 _k10_1 = _mm_loadu_ps(k1 + 12);
            __m128 _k11_1 = _mm_loadu_ps(k1 + 16);
            __m128 _k12_1 = _mm_loadu_ps(k1 + 20);
            __m128 _k20_1 = _mm_loadu_ps(k1 + 24);
            __m128 _k21_1 = _mm_loadu_ps(k1 + 28);
            __m128 _k22_1 = _mm_loadu_ps(k1 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));

                    _sum01 = _mm_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    __m128 _sum02 = _mm_loadu_ps(outptr0 + 8);
                    __m128 _sum12 = _mm_loadu_ps(outptr1 + 8);

                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum02 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum02);

                    _sum12 = _mm_comp_fmadd_ps(_r03, _k00_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r04, _k01_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r05, _k02_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r13, _k10_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r14, _k11_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r15, _k12_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r23, _k20_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r24, _k21_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r25, _k22_1, _sum12);

                    _mm_storeu_ps(outptr0 + 8, _sum02);
                    _mm_storeu_ps(outptr1 + 8, _sum12);

                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));

                    __m128 _sum03 = _mm_loadu_ps(outptr0 + 12);
                    __m128 _sum13 = _mm_loadu_ps(outptr1 + 12);

                    _sum03 = _mm_comp_fmadd_ps(_r04, _k00_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r05, _k01_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r06, _k02_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r14, _k10_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r15, _k11_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r16, _k12_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r24, _k20_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r25, _k21_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r26, _k22_0, _sum03);

                    _sum13 = _mm_comp_fmadd_ps(_r04, _k00_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r05, _k01_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r06, _k02_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r14, _k10_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r15, _k11_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r16, _k12_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r24, _k20_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r25, _k21_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r26, _k22_1, _sum13);

                    _mm_storeu_ps(outptr0 + 12, _sum03);
                    _mm_storeu_ps(outptr1 + 12, _sum13);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 16;
                    outptr1 += 16;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));

                    _sum01 = _mm_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 8;
                    outptr1 += 8;
                }

                for (; j < outw; j++)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 4;
                    outptr1 += 4;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 4;
            k1 += 9 * 4;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00 = _mm_loadu_ps(k0);
            __m128 _k01 = _mm_loadu_ps(k0 + 4);
            __m128 _k02 = _mm_loadu_ps(k0 + 8);
            __m128 _k10 = _mm_loadu_ps(k0 + 12);
            __m128 _k11 = _mm_loadu_ps(k0 + 16);
            __m128 _k12 = _mm_loadu_ps(k0 + 20);
            __m128 _k20 = _mm_loadu_ps(k0 + 24);
            __m128 _k21 = _mm_loadu_ps(k0 + 28);
            __m128 _k22 = _mm_loadu_ps(k0 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m128 _sum1 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    _mm_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r24, _k22, _sum1);

                    __m128 _sum2 = _mm_loadu_ps(outptr0 + 8);
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));
                    _mm_storeu_ps(outptr0 + 4, _sum1);

                    _sum2 = _mm_comp_fmadd_ps(_r03, _k00, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r04, _k01, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r05, _k02, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r13, _k10, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r14, _k11, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r15, _k12, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r23, _k20, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r24, _k21, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r25, _k22, _sum2);

                    __m128 _sum3 = _mm_loadu_ps(outptr0 + 12);
                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));
                    _mm_storeu_ps(outptr0 + 8, _sum2);

                    _sum3 = _mm_comp_fmadd_ps(_r04, _k00, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r05, _k01, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r06, _k02, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r14, _k10, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r15, _k11, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r16, _k12, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r24, _k20, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r25, _k21, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r26, _k22, _sum3);

                    _mm_storeu_ps(outptr0 + 12, _sum3);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 16;
                }
                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m128 _sum1 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    _mm_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r24, _k22, _sum1);

                    _mm_storeu_ps(outptr0 + 4, _sum1);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 8;
                }
                for (; j < outw; j++)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    _mm_storeu_ps(outptr0, _sum0);
                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 4;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 4;
        }
    }
}